

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

void __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::RpcCallContext::~RpcCallContext(RpcCallContext *this)

{
  bool bVar1;
  anon_class_8_1_8991fb9c_for_func local_28;
  Runnable local_20;
  RpcCallContext *local_18;
  
  if (this->responseSent == false) {
    this->responseSent = true;
    local_28.this = this;
    bVar1 = kj::UnwindDetector::isUnwinding(&this->unwindDetector);
    if (bVar1) {
      local_20._vptr_Runnable = (_func_int **)&PTR_run_006703d8;
      local_18 = this;
      kj::UnwindDetector::catchExceptionsAsSecondaryFaults(&this->unwindDetector,&local_20);
    }
    else {
      kj::_::
      RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:1770:51)>
      ::anon_class_8_1_8991fb9c_for_func::operator()(&local_28);
    }
  }
  kj::Own<kj::PromiseFulfiller<void>_>::dispose(&this->cancelFulfiller);
  kj::Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>_>::dispose
            (&(this->tailCallPipelineFulfiller).ptr);
  kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcServerResponse>::~Own
            (&(this->response).ptr);
  ReaderCapabilityTable::~ReaderCapabilityTable(&this->paramsCapTable);
  kj::Own<capnp::IncomingRpcMessage>::dispose(&(this->request).ptr);
  kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>::~Own(&this->connectionState);
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

~RpcCallContext() noexcept(false) {
      if (isFirstResponder()) {
        // We haven't sent a return yet, so we must have been canceled.  Send a cancellation return.
        unwindDetector.catchExceptionsIfUnwinding([&]() {
          // Don't send anything if the connection is broken.
          if (connectionState->connection.is<Connected>()) {
            auto message = connectionState->connection.get<Connected>()->newOutgoingMessage(
                messageSizeHint<rpc::Return>() + sizeInWords<rpc::Payload>());
            auto builder = message->getBody().initAs<rpc::Message>().initReturn();

            builder.setAnswerId(answerId);
            builder.setReleaseParamCaps(false);

            if (redirectResults) {
              // The reason we haven't sent a return is because the results were sent somewhere
              // else.
              builder.setResultsSentElsewhere();
            } else {
              builder.setCanceled();
            }

            message->send();
          }

          cleanupAnswerTable(nullptr, true);
        });
      }
    }